

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-errno.c
# Opt level: O3

void coda_set_error(int err,char *message,...)

{
  char in_AL;
  int *piVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  piVar1 = (int *)__tls_get_addr(&PTR_001d9fb8);
  *piVar1 = err;
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  local_e8.reg_save_area = local_c8;
  coda_set_error_message_vargs(message,&local_e8);
  return;
}

Assistant:

LIBCODA_API void coda_set_error(int err, const char *message, ...)
{
    va_list ap;

    coda_errno = err;

    va_start(ap, message);
    coda_set_error_message_vargs(message, ap);
    va_end(ap);

#ifdef HAVE_HDF4
    if (err == CODA_ERROR_HDF4 && message == NULL)
    {
        coda_hdf4_add_error_message();
    }
#endif
#ifdef HAVE_HDF5
    if (err == CODA_ERROR_HDF5 && message == NULL)
    {
        coda_hdf5_add_error_message();
    }
#endif
}